

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mingw_make.cpp
# Opt level: O3

ProString * __thiscall
MingwMakefileGenerator::fixLibFlag
          (ProString *__return_storage_ptr__,MingwMakefileGenerator *this,ProString *lib)

{
  int iVar1;
  QString string;
  QString string_00;
  QArrayData *pQVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QArrayData *in_stack_fffffffffffffef8;
  char16_t *in_stack_ffffffffffffff00;
  qsizetype in_stack_ffffffffffffff08;
  QString local_f0;
  ProString local_d8;
  undefined1 local_a0 [32];
  QArrayData *local_80;
  QStringBuilder<QLatin1String,_ProString> local_70;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = ProString::startsWith(lib,anon_var_dwarf_37a410 + 1,CaseSensitive);
  if (bVar3) {
    ProString::mid(&local_d8,lib,2,-1);
    MakefileGenerator::escapeFilePath((ProString *)local_a0,(MakefileGenerator *)this,&local_d8);
    local_70.a.m_size = 2;
    local_70.a.m_data = anon_var_dwarf_37a410 + 1;
    ProString::ProString(&local_70.b,(ProString *)local_a0);
    ProString::ProString<QLatin1String,ProString>(__return_storage_ptr__,&local_70);
    if (&(local_70.b.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.b.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.b.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      iVar1 = ((local_70.b.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i;
      UNLOCK();
      pQVar2 = &(local_70.b.m_string.d.d)->super_QArrayData;
joined_r0x001dd456:
      if (iVar1 == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
LAB_001dd0a4:
    if ((QArrayData *)local_a0._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_a0._0_8_,2,0x10);
      }
    }
    if (&(local_d8.m_string.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_001dd38a;
    LOCK();
    ((local_d8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    iVar1 = ((local_d8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    pQVar2 = &(local_d8.m_string.d.d)->super_QArrayData;
  }
  else {
    bVar3 = ProString::startsWith(lib,"-L",CaseSensitive);
    if (bVar3) {
      ProString::mid((ProString *)&local_70,lib,2,-1);
      ProString::toQString((QString *)&stack0xfffffffffffffef8,(ProString *)&local_70);
      if (in_stack_fffffffffffffef8 != (QArrayData *)0x0) {
        LOCK();
        (in_stack_fffffffffffffef8->ref_)._q_value.super___atomic_base<int>._M_i =
             (in_stack_fffffffffffffef8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      string.d.ptr = in_stack_ffffffffffffff00;
      string.d.d = (Data *)in_stack_fffffffffffffef8;
      string.d.size = in_stack_ffffffffffffff08;
      local_a0._0_8_ = in_stack_fffffffffffffef8;
      Option::fixString(&local_f0,string,(uchar)local_a0);
      if ((QArrayData *)local_a0._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_a0._0_8_,2,0x10);
        }
      }
      (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
        _vptr_QMakeSourceFileInfo[0xc])(&local_d8,this,&local_f0);
      local_80 = (QArrayData *)local_d8.m_string.d.size;
      local_a0._24_8_ = local_d8.m_string.d.ptr;
      local_a0._16_8_ = local_d8.m_string.d.d;
      local_a0._0_8_ = (QArrayData *)0x2;
      local_a0._8_8_ = "-L";
      local_d8.m_string.d.d = (Data *)0x0;
      local_d8.m_string.d.ptr = (char16_t *)0x0;
      local_d8.m_string.d.size = 0;
      ProString::ProString<QLatin1String,QString>
                (__return_storage_ptr__,(QStringBuilder<QLatin1String,_QString> *)local_a0);
      if ((QArrayData *)local_a0._16_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_a0._16_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_a0._16_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_a0._16_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_a0._16_8_,2,0x10);
        }
      }
      if (&(local_d8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_d8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_d8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_f0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f0.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (in_stack_fffffffffffffef8 != (QArrayData *)0x0) {
        LOCK();
        (in_stack_fffffffffffffef8->ref_)._q_value.super___atomic_base<int>._M_i =
             (in_stack_fffffffffffffef8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        iVar1 = (in_stack_fffffffffffffef8->ref_)._q_value.super___atomic_base<int>._M_i;
        UNLOCK();
        local_f0.d.d = (Data *)in_stack_fffffffffffffef8;
joined_r0x001dd34b:
        if (iVar1 == 0) {
          QArrayData::deallocate(&(local_f0.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      bVar3 = ProString::startsWith(lib,"lib",CaseSensitive);
      if (!bVar3) {
        ProString::toQString(&local_d8.m_string,lib);
        local_70.a.m_size = (qsizetype)local_d8.m_string.d.d;
        local_70.a.m_data = (char *)local_d8.m_string.d.ptr;
        local_70.b.m_string.d.d = (Data *)local_d8.m_string.d.size;
        if (&(local_d8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_d8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_d8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + 1;
          UNLOCK();
        }
        string_00.d.ptr = in_stack_ffffffffffffff00;
        string_00.d.d = (Data *)in_stack_fffffffffffffef8;
        string_00.d.size = in_stack_ffffffffffffff08;
        Option::fixString((QString *)local_a0,string_00,(uchar)&local_70);
        if ((QArrayData *)local_70.a.m_size != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_70.a.m_size)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_70.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1
          ;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_70.a.m_size)->_q_value).super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate((QArrayData *)local_70.a.m_size,2,0x10);
          }
        }
        (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
          _vptr_QMakeSourceFileInfo[0xc])(&local_70,this,local_a0);
        ProString::ProString(__return_storage_ptr__,(QString *)&local_70);
        if ((QArrayData *)local_70.a.m_size != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_70.a.m_size)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_70.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1
          ;
          iVar1 = (((QBasicAtomicInt *)local_70.a.m_size)->_q_value).super___atomic_base<int>._M_i;
          UNLOCK();
          pQVar2 = (QArrayData *)local_70.a.m_size;
          goto joined_r0x001dd456;
        }
        goto LAB_001dd0a4;
      }
      ProString::mid((ProString *)&local_70,lib,3,-1);
      ProString::toQString(&local_f0,(ProString *)&local_70);
      (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
        _vptr_QMakeSourceFileInfo[0xc])(&local_d8,this,&local_f0);
      local_80 = (QArrayData *)local_d8.m_string.d.size;
      local_a0._24_8_ = local_d8.m_string.d.ptr;
      local_a0._16_8_ = local_d8.m_string.d.d;
      local_a0._0_8_ = (QArrayData *)0x2;
      local_a0._8_8_ = anon_var_dwarf_37a410 + 1;
      local_d8.m_string.d.d = (Data *)0x0;
      local_d8.m_string.d.ptr = (char16_t *)0x0;
      local_d8.m_string.d.size = 0;
      ProString::ProString<QLatin1String,QString>
                (__return_storage_ptr__,(QStringBuilder<QLatin1String,_QString> *)local_a0);
      if ((QArrayData *)local_a0._16_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_a0._16_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_a0._16_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_a0._16_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_a0._16_8_,2,0x10);
        }
      }
      if (&(local_d8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_d8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_d8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_f0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        iVar1 = ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
        UNLOCK();
        goto joined_r0x001dd34b;
      }
    }
    if ((QArrayData *)local_70.a.m_size == (QArrayData *)0x0) goto LAB_001dd38a;
    LOCK();
    (((QBasicAtomicInt *)local_70.a.m_size)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_70.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
    iVar1 = (((QBasicAtomicInt *)local_70.a.m_size)->_q_value).super___atomic_base<int>._M_i;
    UNLOCK();
    pQVar2 = (QArrayData *)local_70.a.m_size;
  }
  if (iVar1 == 0) {
    QArrayData::deallocate(pQVar2,2,0x10);
  }
LAB_001dd38a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

ProString MingwMakefileGenerator::fixLibFlag(const ProString &lib)
{
    if (lib.startsWith("-l"))  // Fallback for unresolved -l libs.
        return QLatin1String("-l") + escapeFilePath(lib.mid(2));
    if (lib.startsWith("-L"))  // Lib search path. Needed only by -l above.
        return QLatin1String("-L")
                + escapeFilePath(Option::fixPathToTargetOS(lib.mid(2).toQString(), false));
    if (lib.startsWith("lib"))  // Fallback for unresolved MSVC-style libs.
        return QLatin1String("-l") + escapeFilePath(lib.mid(3).toQString());
    return escapeFilePath(Option::fixPathToTargetOS(lib.toQString(), false));
}